

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_xsave_x86_64(CPUX86State *env,target_ulong ptr,uint64_t rfbm)

{
  uintptr_t unaff_retaddr;
  
  do_xsave(env,ptr,rfbm,-(ulong)((env->hflags >> 0x1a & 1) != 0) | 0xfffffffffffffff7,
           0xffffffffffffffff,unaff_retaddr);
  return;
}

Assistant:

static uint64_t get_xinuse(CPUX86State *env)
{
    uint64_t inuse = -1;

    /* For the most part, we don't track XINUSE.  We could calculate it
       here for all components, but it's probably less work to simply
       indicate in use.  That said, the state of BNDREGS is important
       enough to track in HFLAGS, so we might as well use that here.  */
    if ((env->hflags & HF_MPX_IU_MASK) == 0) {
       inuse &= ~XSTATE_BNDREGS_MASK;
    }
    return inuse;
}